

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ruby_generator.cc
# Opt level: O0

bool google::protobuf::compiler::ruby::GenerateDslDescriptor
               (FileDescriptor *file,Printer *printer,string *error)

{
  string *this;
  bool bVar1;
  Syntax SVar2;
  int iVar3;
  string *args_1;
  Descriptor *message;
  EnumDescriptor *en;
  Syntax syntax;
  int local_5c;
  int local_58;
  int i_1;
  int i;
  string local_48;
  string *local_28;
  string *error_local;
  Printer *printer_local;
  FileDescriptor *file_local;
  
  local_28 = error;
  error_local = (string *)printer;
  printer_local = (Printer *)file;
  io::Printer::Print<>(printer,"Google::Protobuf::DescriptorPool.generated_pool.build do\n");
  io::Printer::Indent((Printer *)error_local);
  this = error_local;
  args_1 = FileDescriptor::name_abi_cxx11_((FileDescriptor *)printer_local);
  SVar2 = FileDescriptor::syntax((FileDescriptor *)printer_local);
  StringifySyntax_abi_cxx11_(&local_48,(ruby *)(ulong)SVar2,syntax);
  io::Printer::Print<char[9],std::__cxx11::string,char[7],std::__cxx11::string>
            ((Printer *)this,"add_file(\"$filename$\", :syntax => :$syntax$) do\n",
             (char (*) [9])"filename",args_1,(char (*) [7])0x77fe65,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  io::Printer::Indent((Printer *)error_local);
  local_58 = 0;
  while( true ) {
    iVar3 = FileDescriptor::message_type_count((FileDescriptor *)printer_local);
    if (iVar3 <= local_58) {
      for (local_5c = 0; iVar3 = FileDescriptor::enum_type_count((FileDescriptor *)printer_local),
          local_5c < iVar3; local_5c = local_5c + 1) {
        en = FileDescriptor::enum_type((FileDescriptor *)printer_local,local_5c);
        GenerateEnum(en,(Printer *)error_local);
      }
      io::Printer::Outdent((Printer *)error_local);
      io::Printer::Print<>((Printer *)error_local,"end\n");
      io::Printer::Outdent((Printer *)error_local);
      io::Printer::Print<>((Printer *)error_local,"end\n\n");
      return true;
    }
    message = FileDescriptor::message_type((FileDescriptor *)printer_local,local_58);
    bVar1 = GenerateMessage(message,(Printer *)error_local,local_28);
    if (!bVar1) break;
    local_58 = local_58 + 1;
  }
  return false;
}

Assistant:

bool GenerateDslDescriptor(const FileDescriptor* file, io::Printer* printer,
                           std::string* error) {
  printer->Print("Google::Protobuf::DescriptorPool.generated_pool.build do\n");
  printer->Indent();
  printer->Print("add_file(\"$filename$\", :syntax => :$syntax$) do\n",
                 "filename", file->name(), "syntax",
                 StringifySyntax(file->syntax()));
  printer->Indent();
  for (int i = 0; i < file->message_type_count(); i++) {
    if (!GenerateMessage(file->message_type(i), printer, error)) {
      return false;
    }
  }
  for (int i = 0; i < file->enum_type_count(); i++) {
    GenerateEnum(file->enum_type(i), printer);
  }
  printer->Outdent();
  printer->Print("end\n");
  printer->Outdent();
  printer->Print(
    "end\n\n");
  return true;
}